

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lista_tests.cpp
# Opt level: O1

void __thiscall
lista_test_test_agregar_varios_elementos_solo_atras_Test::
~lista_test_test_agregar_varios_elementos_solo_atras_Test
          (lista_test_test_agregar_varios_elementos_solo_atras_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(lista_test, test_agregar_varios_elementos_solo_atras) {
    Lista<int> l;
    l.agregarAtras(42);
    l.agregarAtras(43);
    l.agregarAtras(44);
    l.agregarAtras(45);
    ASSERT_EQ(l.longitud(), 4);
    ASSERT_EQ(l.iesimo(0), 42);
    ASSERT_EQ(l.iesimo(1), 43);
    ASSERT_EQ(l.iesimo(2), 44);
    ASSERT_EQ(l.iesimo(3), 45);
}